

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::Node::DumpProperties(Node *this,StreamWriterLE *s,bool binary,int indent)

{
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream ss;
  int indent_local;
  bool binary_local;
  StreamWriterLE *s_local;
  Node *this_local;
  
  if (binary) {
    DumpPropertiesBinary(this,s);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_198);
    DumpPropertiesAscii(this,(ostream *)local_198,indent);
    std::__cxx11::ostringstream::str();
    StreamWriter<false,_false>::PutString(s,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return;
}

Assistant:

void FBX::Node::DumpProperties(
    Assimp::StreamWriterLE& s,
    bool binary, int indent
) {
    if (binary) {
        DumpPropertiesBinary(s);
    } else {
        std::ostringstream ss;
        DumpPropertiesAscii(ss, indent);
        s.PutString(ss.str());
    }
}